

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generic_writer.cc
# Opt level: O2

pair<char_*,_char_*> __thiscall
tcmalloc::StringGenericWriter::RecycleBuffer
          (StringGenericWriter *this,char *buf_begin,char *buf_end,int want_at_least)

{
  ulong uVar1;
  pointer pcVar2;
  int iVar3;
  string *psVar4;
  ulong uVar5;
  pair<char_*,_char_*> pVar6;
  
  iVar3 = ((int)buf_begin - (int)buf_end) + this->unused_size_;
  this->unused_size_ = iVar3;
  psVar4 = this->s_;
  uVar1 = psVar4->_M_string_length;
  uVar5 = uVar1;
  if (want_at_least - iVar3 != 0 && iVar3 <= want_at_least) {
    uVar5 = (uint)(want_at_least - iVar3) + uVar1;
    if (uVar5 <= uVar1 * 2) {
      uVar5 = uVar1 * 2;
    }
    std::__cxx11::string::resize((ulong)psVar4);
    iVar3 = ((int)uVar5 - (int)uVar1) + this->unused_size_;
    this->unused_size_ = iVar3;
    psVar4 = this->s_;
  }
  pcVar2 = (psVar4->_M_dataplus)._M_p + uVar5;
  pVar6.first = pcVar2 + -(long)iVar3;
  pVar6.second = pcVar2;
  return pVar6;
}

Assistant:

std::pair<char*, char*> StringGenericWriter::RecycleBuffer(char* buf_begin, char* buf_end, int want_at_least) {
  unused_size_ -= buf_end - buf_begin;

  int deficit = want_at_least - unused_size_;
  size_t size = s_->size();
  if (deficit > 0) {
    size_t new_size = std::max(size + deficit, size * 2);
    s_->resize(new_size);
    unused_size_ += new_size - size;
    size = new_size;
  }

  char* ptr = const_cast<char*>(s_->data() + size - unused_size_);
  return {ptr, ptr + unused_size_};
}